

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

bool __thiscall ftxui::TabContainer::OnMouseEvent(TabContainer *this,Event *event)

{
  pointer pcVar1;
  undefined1 uVar2;
  long *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  Type local_58;
  Button BStack_54;
  Motion MStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  long *local_40 [2];
  long local_30 [2];
  ScreenInteractive *local_20;
  
  (*(this->super_ContainerBase).super_ComponentBase._vptr_ComponentBase[4])(&local_68,this);
  local_58 = event->type_;
  BStack_54 = (event->field_1).mouse_.button;
  MStack_50 = (event->field_1).mouse_.motion;
  uStack_4c = *(undefined4 *)((long)&event->field_1 + 8);
  local_48 = *(undefined8 *)((long)&event->field_1 + 0xc);
  pcVar1 = (event->input_)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + (event->input_)._M_string_length);
  local_20 = event->screen_;
  uVar2 = (**(code **)(*local_68 + 0x18))(local_68);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return (bool)uVar2;
}

Assistant:

bool OnMouseEvent(Event event) override {
    return ActiveChild()->OnEvent(event);
  }